

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::anon_unknown_24::DescriptorsByNameEq<google::protobuf::FileDescriptor>::operator()
          (DescriptorsByNameEq<google::protobuf::FileDescriptor> *this,FileDescriptor *lhs,
          FileDescriptor *rhs)

{
  size_t __n;
  int iVar1;
  
  if ((FileDescriptor *)this == lhs) {
    return true;
  }
  __n = (*(undefined8 **)(this + 8))[1];
  if (__n == lhs->name_->_M_string_length) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((void *)**(undefined8 **)(this + 8),(lhs->name_->_M_dataplus)._M_p,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool operator()(const DescriptorT* lhs, const DescriptorT* rhs) const {
    return lhs == rhs || lhs->name() == rhs->name();
  }